

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Filter.cpp
# Opt level: O1

void __thiscall SPC_Filter::run(SPC_Filter *this,short *io,int count)

{
  short *psVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  short sVar9;
  int iVar10;
  short sVar11;
  int iVar12;
  
  iVar2 = this->gain;
  if (this->enabled == true) {
    iVar3 = this->bass;
    lVar6 = 0x24;
    do {
      iVar8 = *(int *)((long)this->ch + lVar6 + -0x10);
      iVar7 = *(int *)((long)(this->ch + -2) + lVar6);
      iVar5 = *(int *)((long)this->ch + lVar6 + -0x14);
      if (0 < count) {
        lVar4 = 0;
        iVar10 = iVar8;
        iVar12 = iVar5;
        do {
          iVar5 = iVar7 + io[lVar4];
          iVar7 = io[lVar4] * 3;
          iVar8 = (iVar10 - (iVar10 >> ((byte)iVar3 & 0x1f))) + (iVar5 - iVar12) * iVar2;
          sVar11 = (short)(iVar10 >> 10);
          sVar9 = (iVar10 < 0) + 0x7fff;
          if ((int)sVar11 == iVar10 >> 10) {
            sVar9 = sVar11;
          }
          io[lVar4] = sVar9;
          lVar4 = lVar4 + 2;
          iVar10 = iVar8;
          iVar12 = iVar5;
        } while (lVar4 < count);
      }
      *(int *)((long)(this->ch + -2) + lVar6) = iVar7;
      *(int *)((long)this->ch + lVar6 + -0x14) = iVar5;
      *(int *)((long)this->ch + lVar6 + -0x10) = iVar8;
      lVar6 = lVar6 + -0xc;
      io = io + 1;
    } while (lVar6 != 0xc);
  }
  else if ((iVar2 != 0x100) && (0 < count)) {
    psVar1 = io + count;
    do {
      iVar8 = *io * iVar2;
      iVar3 = (iVar8 < 0) + 0x7fff;
      if ((int)(short)((uint)iVar8 >> 8) == iVar8 >> 8) {
        iVar3 = iVar8 >> 8;
      }
      *io = (short)iVar3;
      io = io + 1;
    } while (io < psVar1);
  }
  return;
}

Assistant:

void SPC_Filter::run( short* io, int count )
{
	require( (count & 1) == 0 ); // must be even
	
	int const gain = this->gain;
	if ( enabled )
	{
		int const bass = this->bass;
		chan_t* c = &ch [2];
		do
		{
			// cache in registers
			int sum = (--c)->sum;
			int pp1 = c->pp1;
			int p1  = c->p1;
			
			for ( int i = 0; i < count; i += 2 )
			{
				// Low-pass filter (two point FIR with coeffs 0.25, 0.75)
				int f = io [i] + p1;
				p1 = io [i] * 3;
				
				// High-pass filter ("leaky integrator")
				int delta = f - pp1;
				pp1 = f;
				int s = sum >> (gain_bits + 2);
				sum += (delta * gain) - (sum >> bass);
				
				// Clamp to 16 bits
				if ( (short) s != s )
					s = (s >> 31) ^ 0x7FFF;
				
				io [i] = (short) s;
			}
			
			c->p1  = p1;
			c->pp1 = pp1;
			c->sum = sum;
			++io;
		}
		while ( c != ch );
	}
	else if ( gain != gain_unit )
	{
		short* const end = io + count;
		while ( io < end )
		{
			int s = (*io * gain) >> gain_bits;
			if ( (short) s != s )
				s = (s >> 31) ^ 0x7FFF;
			*io++ = (short) s;
		}
	}
}